

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

uv_handle_type uv__handle_type(int fd)

{
  int iVar1;
  int in_EDI;
  int type;
  socklen_t len;
  sockaddr_storage ss;
  int local_90 [2];
  sockaddr local_88 [8];
  int local_8;
  uv_handle_type local_4;
  
  local_8 = in_EDI;
  memset(local_88,0,0x80);
  local_90[1] = 0x80;
  iVar1 = getsockname(local_8,local_88,(socklen_t *)(local_90 + 1));
  if (iVar1 == 0) {
    local_90[1] = 4;
    iVar1 = getsockopt(local_8,1,3,local_90,(socklen_t *)(local_90 + 1));
    if (iVar1 == 0) {
      if (local_90[0] == 1) {
        if (local_88[0].sa_family == 1) {
          return UV_NAMED_PIPE;
        }
        if ((local_88[0].sa_family == 2) || (local_88[0].sa_family == 10)) {
          return UV_TCP;
        }
      }
      if ((local_90[0] == 2) && ((local_88[0].sa_family == 2 || (local_88[0].sa_family == 10)))) {
        local_4 = UV_UDP;
      }
      else {
        local_4 = UV_UNKNOWN_HANDLE;
      }
    }
    else {
      local_4 = UV_UNKNOWN_HANDLE;
    }
  }
  else {
    local_4 = UV_UNKNOWN_HANDLE;
  }
  return local_4;
}

Assistant:

static uv_handle_type uv__handle_type(int fd) {
  struct sockaddr_storage ss;
  socklen_t len;
  int type;

  memset(&ss, 0, sizeof(ss));
  len = sizeof(ss);

  if (getsockname(fd, (struct sockaddr*)&ss, &len))
    return UV_UNKNOWN_HANDLE;

  len = sizeof type;

  if (getsockopt(fd, SOL_SOCKET, SO_TYPE, &type, &len))
    return UV_UNKNOWN_HANDLE;

  if (type == SOCK_STREAM) {
    switch (ss.ss_family) {
      case AF_UNIX:
        return UV_NAMED_PIPE;
      case AF_INET:
      case AF_INET6:
        return UV_TCP;
      }
  }

  if (type == SOCK_DGRAM &&
      (ss.ss_family == AF_INET || ss.ss_family == AF_INET6))
    return UV_UDP;

  return UV_UNKNOWN_HANDLE;
}